

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeNode.h
# Opt level: O2

TreeNode<ObservationHistory> * __thiscall
TreeNode<ObservationHistory>::GetSuccessor(TreeNode<ObservationHistory> *this,LIndex sucI)

{
  iterator iVar1;
  mapped_type *ppTVar2;
  EInvalidIndex *this_00;
  LIndex sucI_local;
  
  sucI_local = sucI;
  iVar1 = std::
          _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>,_std::_Select1st<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
          ::find(&(this->_m_successor)._M_t,&sucI_local);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_m_successor)._M_t._M_impl.super__Rb_tree_header)
  {
    ppTVar2 = std::
              map<unsigned_long_long,_TreeNode<ObservationHistory>_*,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_TreeNode<ObservationHistory>_*>_>_>
              ::operator[](&this->_m_successor,&sucI_local);
    return *ppTVar2;
  }
  this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
  EInvalidIndex::EInvalidIndex(this_00,"TreeNode::GetSuccessor successor not found");
  __cxa_throw(this_00,&EInvalidIndex::typeinfo,E::~E);
}

Assistant:

TreeNode<Tcontained>* TreeNode<Tcontained>::GetSuccessor(LIndex sucI)
{
    if(_m_successor.find(sucI)==_m_successor.end())
        throw EInvalidIndex("TreeNode::GetSuccessor successor not found");
    else
        return(_m_successor[sucI]);
}